

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<const_capnp::PipelineOp>::~Array(Array<const_capnp::PipelineOp> *this)

{
  Array<const_capnp::PipelineOp> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }